

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::container_internal::
btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
::is_ordered_correctly<std::less<std::pair<int,int>>>
          (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           *this,field_type i,less<std::pair<int,_int>_> *comp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  byte bVar5;
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
  bVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  
  bVar5 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::start((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                   *)this);
  if (((ulong)this & 7) == 0) {
    uVar8 = (ulong)i;
    uVar7 = (ulong)bVar5;
    uVar9 = 0xffffffff;
    do {
      bVar6 = SUB81(uVar7,0);
      if ((byte)this[10] <= (byte)bVar6) {
LAB_001e0e88:
        return (byte)this[10] <= (byte)bVar6;
      }
      if ((btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
           )i == bVar6) {
        uVar10 = uVar9;
        if (0 < (int)uVar9) goto LAB_001e0e88;
      }
      else {
        iVar2 = *(int *)(this + uVar7 * 8 + 0xc);
        iVar3 = *(int *)(this + uVar8 * 8 + 0xc);
        pcVar11 = &weak_ordering::less;
        if ((iVar3 <= iVar2) &&
           ((iVar3 < iVar2 ||
            (pcVar11 = &weak_ordering::less,
            *(int *)(this + uVar8 * 8 + 0x10) <= *(int *)(this + uVar7 * 8 + 0x10))))) {
          bVar4 = *(int *)(this + uVar8 * 8 + 0x10) < *(int *)(this + uVar7 * 8 + 0x10);
          if (iVar2 != iVar3) {
            bVar4 = iVar3 < iVar2;
          }
          pcVar11 = "\x01";
          if (!bVar4) {
            pcVar11 = "";
          }
        }
        cVar1 = *pcVar11;
        uVar10 = 0xffffffff;
        if (-1 < cVar1) {
          uVar10 = (uint)('\0' < cVar1);
        }
        if (cVar1 == '\0' || (int)uVar10 < (int)uVar9) goto LAB_001e0e88;
      }
      uVar7 = uVar7 + 1;
      uVar9 = uVar10;
    } while (((ulong)this & 7) == 0);
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
               );
}

Assistant:

bool is_ordered_correctly(field_type i, const Compare &comp) const {
    if (std::is_base_of<BtreeTestOnlyCheckedCompareOptOutBase,
                        Compare>::value ||
        params_type::kIsKeyCompareStringAdapted) {
      return true;
    }

    const auto compare = [&](field_type a, field_type b) {
      const absl::weak_ordering cmp =
          compare_internal::do_three_way_comparison(comp, key(a), key(b));
      return cmp < 0 ? -1 : cmp > 0 ? 1 : 0;
    };
    int cmp = -1;
    constexpr bool kCanHaveEquivKeys =
        params_type::template can_have_multiple_equivalent_keys<key_type>();
    for (field_type j = start(); j < finish(); ++j) {
      if (j == i) {
        if (cmp > 0) return false;
        continue;
      }
      int new_cmp = compare(j, i);
      if (new_cmp < cmp || (!kCanHaveEquivKeys && new_cmp == 0)) return false;
      cmp = new_cmp;
    }
    return true;
  }